

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

ThreadPool * ThreadPool::instance(void)

{
  ThreadPool *this;
  long lVar1;
  
  if (sInstance == (ThreadPool *)0x0) {
    this = (ThreadPool *)operator_new(0xd8);
    lVar1 = sysconf(0x54);
    ThreadPool(this,(int)lVar1,Normal,0);
    sInstance = this;
  }
  return sInstance;
}

Assistant:

ThreadPool* ThreadPool::instance()
{
    if (!sInstance)
        sInstance = new ThreadPool(idealThreadCount());
    return sInstance;
}